

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O0

t_int * upsampling_perform_0(t_int *w)

{
  t_sample *ptVar1;
  t_int tVar2;
  t_int tVar3;
  int iVar4;
  bool bVar5;
  t_sample *dummy;
  int n;
  int parent;
  int up;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  out = (t_sample *)w[1];
  ptVar1 = (t_sample *)w[2];
  tVar2 = w[3];
  tVar3 = w[4];
  dummy._4_4_ = (int)tVar3 * (int)tVar2;
  _parent = ptVar1;
  while (iVar4 = dummy._4_4_ + -1, bVar5 = dummy._4_4_ != 0, dummy._4_4_ = (int)tVar3, bVar5) {
    *_parent = 0.0;
    dummy._4_4_ = iVar4;
    _parent = _parent + 1;
  }
  while (_parent = ptVar1, dummy._4_4_ != 0) {
    *_parent = *out;
    dummy._4_4_ = dummy._4_4_ + -1;
    ptVar1 = _parent + (int)tVar2;
    out = out + 1;
  }
  return w + 5;
}

Assistant:

t_int *upsampling_perform_0(t_int *w)
{
  t_sample *in  = (t_sample *)(w[1]); /* original signal     */
  t_sample *out = (t_sample *)(w[2]); /* upsampled signal    */
  int up       = (int)(w[3]);       /* upsampling factor   */
  int parent   = (int)(w[4]);       /* original vectorsize */

  int n=parent*up;
  t_sample *dummy = out;

  while(n--)*out++=0;

  n = parent;
  out = dummy;
  while(n--){
    *out=*in++;
    out+=up;
  }

  return (w+5);
}